

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestTestHandler::CleanTestOutput(cmCTestTestHandler *this,string *output,size_t length)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  char *last;
  pointer first;
  ostringstream msg;
  long *local_1c8;
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  if ((length != 0) && (length < output->_M_string_length)) {
    lVar3 = std::__cxx11::string::find((char *)output,0x62dd0e,0);
    if (lVar3 == -1) {
      first = (output->_M_dataplus)._M_p;
      last = first + output->_M_string_length;
      pcVar2 = first + length;
      do {
        if (pcVar2 <= first) break;
        pcVar4 = cm_utf8_decode_character(first,last,(uint *)local_1a8);
        pcVar1 = first + 1;
        if (pcVar4 <= pcVar2) {
          first = pcVar4;
        }
        if (pcVar4 == (char *)0x0) {
          first = pcVar1;
        }
      } while (pcVar4 <= pcVar2);
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)output);
      std::__cxx11::string::operator=((string *)output,(string *)local_1a8);
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0],local_198[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "...\nThe rest of the test output was removed since it exceeds the threshold of ",
                 0x4e);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes.\n",8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)output,(ulong)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::CleanTestOutput(std::string& output, size_t length)
{
  if (!length || length >= output.size() ||
      output.find("CTEST_FULL_OUTPUT") != std::string::npos) {
    return true;
  }

  // Truncate at given length but do not break in the middle of a multi-byte
  // UTF-8 encoding.
  char const* const begin = output.c_str();
  char const* const end = begin + output.size();
  char const* const truncate = begin + length;
  char const* current = begin;
  while (current < truncate) {
    unsigned int ch;
    if (const char* next = cm_utf8_decode_character(current, end, &ch)) {
      if (next > truncate) {
        break;
      }
      current = next;
    } else // Bad byte will be handled by cmXMLWriter.
    {
      ++current;
    }
  }
  output = output.substr(0, current - begin);

  // Append truncation message.
  std::ostringstream msg;
  msg << "...\n"
         "The rest of the test output was removed since it exceeds the "
         "threshold "
         "of "
      << length << " bytes.\n";
  output += msg.str();
  return true;
}